

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiDeviceInitializationTests.cpp
# Opt level: O1

TestStatus *
vkt::api::anon_unknown_1::createDeviceWithVariousQueueCountsTest
          (TestStatus *__return_storage_ptr__,Context *context)

{
  ostringstream *this;
  deUint32 dVar1;
  deUint32 queueFamilyIndex;
  PlatformInterface *vkPlatform;
  TestLog *pTVar2;
  undefined8 uVar3;
  VkResult VVar4;
  VkPhysicalDevice physicalDevice;
  VkQueue queue;
  TestError *this_00;
  uint uVar5;
  long lVar6;
  ulong uVar7;
  uint uVar8;
  deUint32 queueIndex;
  ulong uVar9;
  vector<vk::VkDeviceQueueCreateInfo,_std::allocator<vk::VkDeviceQueueCreateInfo>_>
  deviceQueueCreateInfos;
  vector<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
  queueFamilyProperties;
  vector<float,_std::allocator<float>_> queuePriorities;
  VkDeviceCreateInfo deviceCreateInfo;
  VkDeviceQueueCreateInfo queueCreateInfo;
  InstanceDriver instanceDriver;
  VkDeviceQueueCreateInfo *local_8f8;
  iterator iStack_8f0;
  VkDeviceQueueCreateInfo *local_8e8;
  VkAllocationCallbacks *local_8d8;
  DestroyInstanceFunc local_8d0;
  TestStatus *local_8c8;
  vector<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_> local_8c0;
  VkAllocationCallbacks *local_8a8;
  DestroyInstanceFunc local_8a0;
  VkInstance local_898;
  TestLog *local_890;
  VkDeviceQueueCreateInfo *local_888;
  VkPhysicalDevice local_880;
  ulong local_878;
  vector<float,_std::allocator<float>_> local_870;
  VkDeviceCreateInfo local_858;
  Enum<vk::VkResult,_4UL> local_808;
  undefined1 local_7f8 [16];
  TestLog local_7e8 [13];
  ios_base local_780 [264];
  undefined1 local_678 [16];
  VkDeviceQueueCreateFlags local_668;
  deUint32 dStack_664;
  uint uStack_660;
  undefined4 uStack_65c;
  float *local_658;
  InstanceDriver local_1b8;
  
  vkPlatform = context->m_platformInterface;
  pTVar2 = context->m_testCtx->m_log;
  local_8c8 = __return_storage_ptr__;
  ::vk::createDefaultInstance((Move<vk::VkInstance_s_*> *)local_678,vkPlatform);
  uVar3 = local_678._0_8_;
  local_8a0 = (DestroyInstanceFunc)local_678._8_8_;
  local_8a8 = (VkAllocationCallbacks *)CONCAT44(dStack_664,local_668);
  local_898 = (VkInstance)local_678._0_8_;
  ::vk::InstanceDriver::InstanceDriver(&local_1b8,vkPlatform,(VkInstance)local_678._0_8_);
  physicalDevice =
       ::vk::chooseDevice(&local_1b8.super_InstanceInterface,(VkInstance)uVar3,
                          context->m_testCtx->m_cmdLine);
  ::vk::getPhysicalDeviceQueueFamilyProperties
            (&local_8c0,&local_1b8.super_InstanceInterface,physicalDevice);
  uVar5 = (int)((ulong)((long)local_8c0.
                              super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)local_8c0.
                             super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x55555555;
  uVar9 = 0;
  if (uVar5 != 0) {
    lVar6 = 0;
    uVar7 = uVar9;
    do {
      uVar8 = *(uint *)((long)&(local_8c0.
                                super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
                                ._M_impl.super__Vector_impl_data._M_start)->queueCount + lVar6);
      uVar9 = (ulong)uVar8;
      if (uVar8 < (uint)uVar7) {
        uVar9 = uVar7;
      }
      lVar6 = lVar6 + 0x18;
      uVar7 = uVar9;
    } while ((ulong)uVar5 * 0x18 != lVar6);
  }
  local_678._0_4_ = 0x3f800000;
  local_890 = pTVar2;
  local_880 = physicalDevice;
  std::vector<float,_std::allocator<float>_>::vector
            (&local_870,uVar9,(value_type_conflict3 *)local_678,(allocator_type *)local_7f8);
  local_8f8 = (VkDeviceQueueCreateInfo *)0x0;
  iStack_8f0._M_current = (VkDeviceQueueCreateInfo *)0x0;
  local_8e8 = (VkDeviceQueueCreateInfo *)0x0;
  if ((int)((ulong)((long)local_8c0.
                          super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_8c0.
                         super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
                         ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x55555555 != 0) {
    uVar9 = 0;
    do {
      uVar5 = local_8c0.
              super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
              ._M_impl.super__Vector_impl_data._M_start[uVar9].queueCount;
      if (uVar5 != 0) {
        uVar8 = 1;
        do {
          local_678._0_4_ = 2;
          local_678._8_8_ = (DestroyInstanceFunc)0x0;
          local_668 = 0;
          dStack_664 = (deUint32)uVar9;
          local_658 = local_870.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start;
          uStack_660 = uVar8;
          if (iStack_8f0._M_current == local_8e8) {
            std::vector<vk::VkDeviceQueueCreateInfo,std::allocator<vk::VkDeviceQueueCreateInfo>>::
            _M_realloc_insert<vk::VkDeviceQueueCreateInfo_const&>
                      ((vector<vk::VkDeviceQueueCreateInfo,std::allocator<vk::VkDeviceQueueCreateInfo>>
                        *)&local_8f8,iStack_8f0,(VkDeviceQueueCreateInfo *)local_678);
          }
          else {
            (iStack_8f0._M_current)->pQueuePriorities =
                 local_870.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start;
            (iStack_8f0._M_current)->flags = (int)(uVar9 << 0x20);
            (iStack_8f0._M_current)->queueFamilyIndex = (int)((uVar9 << 0x20) >> 0x20);
            *(ulong *)&(iStack_8f0._M_current)->queueCount = CONCAT44(uStack_65c,uVar8);
            (iStack_8f0._M_current)->sType = VK_STRUCTURE_TYPE_DEVICE_QUEUE_CREATE_INFO;
            *(undefined4 *)&(iStack_8f0._M_current)->field_0x4 = local_678._4_4_;
            *(undefined4 *)&(iStack_8f0._M_current)->pNext = 0;
            *(undefined4 *)((long)&(iStack_8f0._M_current)->pNext + 4) = 0;
            iStack_8f0._M_current = iStack_8f0._M_current + 1;
          }
          uVar8 = uVar8 + 1;
        } while (uVar8 <= uVar5);
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 < (uint)((int)((ulong)((long)local_8c0.
                                                super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
                                                ._M_impl.super__Vector_impl_data._M_finish -
                                         (long)local_8c0.
                                               super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
                                               ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                           -0x55555555));
  }
  if (iStack_8f0._M_current != local_8f8) {
    uVar9 = 0;
    do {
      local_888 = local_8f8 + uVar9;
      local_858.pNext = (void *)0x0;
      local_858.enabledExtensionCount = 0;
      local_858._52_4_ = 0;
      local_858.ppEnabledExtensionNames = (char **)0x0;
      local_858.enabledLayerCount = 0;
      local_858._36_4_ = 0;
      local_858.ppEnabledLayerNames = (char **)0x0;
      local_858.pEnabledFeatures = (VkPhysicalDeviceFeatures *)0x0;
      local_858.sType = VK_STRUCTURE_TYPE_DEVICE_CREATE_INFO;
      local_858._4_4_ = 0;
      local_858.flags = 0;
      local_858.queueCreateInfoCount = 1;
      local_878 = uVar9;
      local_858.pQueueCreateInfos = local_888;
      ::vk::createDevice((Move<vk::VkDevice_s_*> *)local_678,&local_1b8.super_InstanceInterface,
                         local_880,&local_858,(VkAllocationCallbacks *)0x0);
      uVar3 = local_678._0_8_;
      local_8d0 = (DestroyInstanceFunc)local_678._8_8_;
      local_8d8 = (VkAllocationCallbacks *)CONCAT44(dStack_664,local_668);
      ::vk::DeviceDriver::DeviceDriver
                ((DeviceDriver *)local_678,&local_1b8.super_InstanceInterface,
                 (VkDevice)local_678._0_8_);
      dVar1 = (local_858.pQueueCreateInfos)->queueCount;
      if (dVar1 != 0) {
        queueFamilyIndex = (local_858.pQueueCreateInfos)->queueFamilyIndex;
        queueIndex = 0;
        do {
          queue = ::vk::getDeviceQueue
                            ((DeviceInterface *)local_678,(VkDevice)uVar3,queueFamilyIndex,
                             queueIndex);
          if (queue == (VkQueue)0x0) {
            this_00 = (TestError *)__cxa_allocate_exception(0x38);
            tcu::TestError::TestError
                      (this_00,(char *)0x0,"!!queue",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiDeviceInitializationTests.cpp"
                       ,0x264);
            __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
          }
          VVar4 = ::vk::DeviceDriver::queueWaitIdle((DeviceDriver *)local_678,queue);
          if (VVar4 != VK_SUCCESS) {
            this = (ostringstream *)(local_7f8 + 8);
            local_7f8._0_8_ = local_890;
            std::__cxx11::ostringstream::ostringstream(this);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)this,"vkQueueWaitIdle failed",0x16);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)this,",  queueIndex = ",0x10);
            std::ostream::_M_insert<unsigned_long>((ulong)this);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)this,", queueCreateInfo ",0x12);
            ::vk::operator<<((ostream *)this,local_888);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,", Error Code: ",0xe)
            ;
            local_808.m_getName = ::vk::getResultName;
            local_808.m_value = VVar4;
            tcu::Format::Enum<vk::VkResult,_4UL>::toStream(&local_808,(ostream *)this);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_7f8,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::ostringstream::~ostringstream(this);
            std::ios_base::~ios_base(local_780);
            local_7f8._0_8_ = local_7e8;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_7f8,"Fail","");
            local_8c8->m_code = QP_TEST_RESULT_FAIL;
            (local_8c8->m_description)._M_dataplus._M_p =
                 (pointer)&(local_8c8->m_description).field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_8c8->m_description,local_7f8._0_8_,
                       (long)(qpTestLog **)local_7f8._0_8_ + local_7f8._8_8_);
            if ((TestLog *)local_7f8._0_8_ != local_7e8) {
              operator_delete((void *)local_7f8._0_8_,
                              (ulong)((long)&(local_7e8[0].m_log)->flags + 1));
            }
            ::vk::DeviceDriver::~DeviceDriver((DeviceDriver *)local_678);
            if ((VkDevice)uVar3 != (VkDevice)0x0) {
              (*local_8d0)((VkInstance)uVar3,local_8d8);
            }
            goto LAB_003f5a56;
          }
          queueIndex = queueIndex + 1;
        } while (dVar1 != queueIndex);
      }
      ::vk::DeviceDriver::~DeviceDriver((DeviceDriver *)local_678);
      if ((VkDevice)uVar3 != (VkDevice)0x0) {
        (*local_8d0)((VkInstance)uVar3,local_8d8);
      }
      uVar9 = local_878 + 1;
    } while (uVar9 < (ulong)(((long)iStack_8f0._M_current - (long)local_8f8 >> 3) *
                            -0x3333333333333333));
  }
  local_678._0_8_ = (VkDevice)&local_668;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_678,"Pass","");
  local_8c8->m_code = QP_TEST_RESULT_PASS;
  (local_8c8->m_description)._M_dataplus._M_p = (pointer)&(local_8c8->m_description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_8c8->m_description,local_678._0_8_,
             (DestroyInstanceFunc)(local_678._8_8_ + local_678._0_8_));
  if ((VkDevice)local_678._0_8_ != (VkDevice)&local_668) {
    operator_delete((void *)local_678._0_8_,CONCAT44(dStack_664,local_668) + 1);
  }
LAB_003f5a56:
  if (local_8f8 != (VkDeviceQueueCreateInfo *)0x0) {
    operator_delete(local_8f8,(long)local_8e8 - (long)local_8f8);
  }
  if (local_870.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (float *)0x0) {
    operator_delete(local_870.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_870.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_870.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_8c0.
      super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_8c0.
                    super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_8c0.
                          super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_8c0.
                          super__Vector_base<vk::VkQueueFamilyProperties,_std::allocator<vk::VkQueueFamilyProperties>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  ::vk::InstanceDriver::~InstanceDriver(&local_1b8);
  if (local_898 != (VkInstance)0x0) {
    (*local_8a0)(local_898,local_8a8);
  }
  return local_8c8;
}

Assistant:

tcu::TestStatus createDeviceWithVariousQueueCountsTest (Context& context)
{
	tcu::TestLog&							log						= context.getTestContext().getLog();
	const int								queueCountDiff			= 1;
	const PlatformInterface&				platformInterface		= context.getPlatformInterface();
	const Unique<VkInstance>				instance				(createDefaultInstance(platformInterface));
	const InstanceDriver					instanceDriver			(platformInterface, instance.get());
	const VkPhysicalDevice					physicalDevice			= chooseDevice(instanceDriver, instance.get(), context.getTestContext().getCommandLine());
	const vector<VkQueueFamilyProperties>	queueFamilyProperties	= getPhysicalDeviceQueueFamilyProperties(instanceDriver, physicalDevice);
	const vector<float>						queuePriorities			(getGlobalMaxQueueCount(queueFamilyProperties), 1.0f);
	vector<VkDeviceQueueCreateInfo>			deviceQueueCreateInfos;

	for (deUint32 queueFamilyNdx = 0; queueFamilyNdx < (deUint32)queueFamilyProperties.size(); queueFamilyNdx++)
	{
		const deUint32 maxQueueCount = queueFamilyProperties[queueFamilyNdx].queueCount;

		for (deUint32 queueCount = 1; queueCount <= maxQueueCount; queueCount += queueCountDiff)
		{
			const VkDeviceQueueCreateInfo queueCreateInfo =
			{
				VK_STRUCTURE_TYPE_DEVICE_QUEUE_CREATE_INFO,
				DE_NULL,
				(VkDeviceQueueCreateFlags)0u,
				queueFamilyNdx,
				queueCount,
				queuePriorities.data()
			};

			deviceQueueCreateInfos.push_back(queueCreateInfo);
		}
	}

	for (size_t testNdx = 0; testNdx < deviceQueueCreateInfos.size(); testNdx++)
	{
		const VkDeviceQueueCreateInfo&	queueCreateInfo		= deviceQueueCreateInfos[testNdx];
		const VkDeviceCreateInfo		deviceCreateInfo	=
		{
			VK_STRUCTURE_TYPE_DEVICE_CREATE_INFO,	//sType;
			DE_NULL,								//pNext;
			(VkDeviceCreateFlags)0u,
			1,										//queueRecordCount;
			&queueCreateInfo,						//pRequestedQueues;
			0,										//layerCount;
			DE_NULL,								//ppEnabledLayerNames;
			0,										//extensionCount;
			DE_NULL,								//ppEnabledExtensionNames;
			DE_NULL,								//pEnabledFeatures;
		};
		const Unique<VkDevice>			device				(createDevice(instanceDriver, physicalDevice, &deviceCreateInfo));
		const DeviceDriver				deviceDriver		(instanceDriver, device.get());
		const deUint32					queueFamilyIndex	= deviceCreateInfo.pQueueCreateInfos->queueFamilyIndex;
		const deUint32					queueCount			= deviceCreateInfo.pQueueCreateInfos->queueCount;

		for (deUint32 queueIndex = 0; queueIndex < queueCount; queueIndex++)
		{
			const VkQueue		queue	= getDeviceQueue(deviceDriver, *device, queueFamilyIndex, queueIndex);
			VkResult			result;

			TCU_CHECK(!!queue);

			result = deviceDriver.queueWaitIdle(queue);
			if (result != VK_SUCCESS)
			{
				log << TestLog::Message
					<< "vkQueueWaitIdle failed"
					<< ",  queueIndex = " << queueIndex
					<< ", queueCreateInfo " << queueCreateInfo
					<< ", Error Code: " << result
					<< TestLog::EndMessage;
				return tcu::TestStatus::fail("Fail");
			}
		}
	}
	return tcu::TestStatus::pass("Pass");
}